

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O1

void __thiscall SpecificStrategy::process(SpecificStrategy *this)

{
  _Rb_tree_header *p_Var1;
  CFG *a;
  Addr addr;
  long lVar2;
  char cVar3;
  bool bVar4;
  CFG *b;
  ostream *poVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  SpecificStrategy *this_00;
  Stats bStats;
  Stats aStats;
  Report report;
  int local_548;
  uint local_544;
  int local_540;
  int local_53c;
  int local_538;
  int local_534;
  Stats local_530;
  Stats local_500;
  ostream *local_4d0;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  int local_498;
  int local_494;
  ulong local_490;
  Stats local_488;
  Stats local_458;
  undefined1 *local_428;
  _Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_> local_420;
  Report local_3f0;
  
  local_530._vptr_Stats = (_func_int **)&PTR__Stats_00117cf8;
  local_530.instrs = 0;
  local_530.blocks.perfect = 0;
  local_530.blocks.conflict = 0;
  local_530.phantoms = 0;
  local_530.edges.internal.perfect = 0;
  local_530.edges.internal.conflict = 0;
  local_530.edges.external.perfect = 0;
  local_530.edges.external.conflict = 0;
  local_530.calls = 0;
  local_530.indirects = 0;
  local_500._vptr_Stats = (_func_int **)&PTR__Stats_00117cf8;
  local_500.instrs = 0;
  local_500.blocks.perfect = 0;
  local_500.blocks.conflict = 0;
  local_500.phantoms = 0;
  local_500.edges.internal.perfect = 0;
  local_500.edges.internal.conflict = 0;
  local_500.edges.external.perfect = 0;
  local_500.edges.external.conflict = 0;
  local_490 = 0;
  local_500.calls = 0;
  local_500.indirects = 0;
  local_4d0 = (ostream *)&(this->super_Strategy).m_fout;
  local_428 = &(this->super_Strategy).field_0xd8;
  cVar3 = std::__basic_file<char>::is_open();
  poVar5 = local_4d0;
  if (cVar3 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_4d0,"cfg,type,instrs,blocks_perfect,blocks_conflict,",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"phantoms,",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"edges_internal_perfect,edges_internal_conflict,",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"edges_external_perfect,edges_external_conflict,",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"calls,indirect",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  CFGsContainer::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&local_420,
                      (this->super_Strategy).m_a);
  p_Var1 = &local_420._M_impl.super__Rb_tree_header;
  local_534 = local_530.instrs;
  if ((_Rb_tree_header *)local_420._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    local_544 = local_530.blocks.perfect;
    local_540 = local_530.blocks.conflict;
    local_53c = local_530.phantoms;
    local_538 = local_530.edges.internal.perfect;
    local_548 = local_530.edges.internal.conflict;
    local_494 = local_530.edges.external.perfect;
    local_498 = local_530.edges.external.conflict;
    local_49c = local_530.calls;
    local_4a0 = local_530.indirects;
    local_4a4 = local_500.instrs;
    local_4a8 = local_500.blocks.perfect;
    local_4ac = local_500.blocks.conflict;
    local_4b0 = local_500.phantoms;
    local_4b4 = local_500.edges.internal.perfect;
    local_4b8 = local_500.edges.internal.conflict;
    local_4bc = local_500.edges.external.perfect;
    local_4c0 = local_500.edges.external.conflict;
    local_4c4 = local_500.calls;
    local_4c8 = local_500.indirects;
    local_490 = 0;
    p_Var7 = local_420._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      a = *(CFG **)(p_Var7 + 1);
      if (a->m_status == VALID) {
        addr = a->m_addr;
        bVar4 = Strategy::isAddrInRange(&this->super_Strategy,addr);
        if (bVar4) {
          b = CFGsContainer::cfg((this->super_Strategy).m_b,addr);
          if ((b != (CFG *)0x0) && (b->m_status == VALID)) {
            this_00 = this;
            compareCFGs(&local_3f0,this,a,b);
            extractStats(&local_458,this_00,&local_3f0.present);
            extractStats(&local_488,this_00,&local_3f0.missing);
            if ((this->super_Strategy).m_config.detailed == true) {
              *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5
                   | 8;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CFG 0x",6);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
              *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5
                   | 2;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"present: ",9);
              operator<<((ostream *)&std::cout,&local_458);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
              std::ostream::put(-0x18);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"missing: ",9);
              operator<<((ostream *)&std::cout,&local_488);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
              std::ostream::put(-0x18);
              std::ostream::flush();
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
              std::ostream::put(-0x18);
              std::ostream::flush();
            }
            cVar3 = std::__basic_file<char>::is_open();
            if (cVar3 != '\0') {
              std::__ostream_insert<char,std::char_traits<char>>(local_4d0,"0x",2);
              lVar2 = *(long *)(*(long *)&(this->super_Strategy).m_fout + -0x18);
              *(uint *)(&(this->super_Strategy).field_0x80 + lVar2) =
                   *(uint *)(&(this->super_Strategy).field_0x80 + lVar2) & 0xffffffb5 | 8;
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_4d0);
              *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
                   *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",present,",9);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_458.instrs);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_458.blocks.perfect);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_458.blocks.conflict);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_458.phantoms);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_458.edges.internal.perfect);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_458.edges.internal.conflict)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_458.edges.external.perfect);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_458.edges.external.conflict)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_458.calls);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              plVar6 = (long *)std::ostream::operator<<((ostream *)poVar5,local_458.indirects);
              std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
              std::ostream::put((char)plVar6);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>(local_4d0,"0x",2);
              lVar2 = *(long *)(*(long *)&(this->super_Strategy).m_fout + -0x18);
              *(uint *)(&(this->super_Strategy).field_0x80 + lVar2) =
                   *(uint *)(&(this->super_Strategy).field_0x80 + lVar2) & 0xffffffb5 | 8;
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_4d0);
              *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
                   *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",missing,",9);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_488.instrs);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_488.blocks.perfect);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_488.blocks.conflict);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_488.phantoms);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_488.edges.internal.perfect);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_488.edges.internal.conflict)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_488.edges.external.perfect);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_488.edges.external.conflict)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_488.calls);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              plVar6 = (long *)std::ostream::operator<<((ostream *)poVar5,local_488.indirects);
              std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
              std::ostream::put((char)plVar6);
              std::ostream::flush();
            }
            local_534 = local_534 + local_458.instrs;
            local_544 = local_544 + local_458.blocks.perfect;
            local_540 = local_540 + local_458.blocks.conflict;
            local_53c = local_53c + local_458.phantoms;
            local_538 = local_538 + local_458.edges.internal.perfect;
            local_548 = local_548 + local_458.edges.internal.conflict;
            local_494 = local_494 + local_458.edges.external.perfect;
            local_498 = local_498 + local_458.edges.external.conflict;
            local_49c = local_49c + local_458.calls;
            local_530.edges.external.conflict = local_498;
            local_530.edges.external.perfect = local_494;
            local_4a0 = local_4a0 + local_458.indirects;
            local_530.indirects = local_4a0;
            local_530.calls = local_49c;
            local_4a4 = local_4a4 + local_488.instrs;
            local_4a8 = local_4a8 + local_488.blocks.perfect;
            local_4ac = local_4ac + local_488.blocks.conflict;
            local_500.blocks.perfect = local_4a8;
            local_500.instrs = local_4a4;
            local_4b0 = local_4b0 + local_488.phantoms;
            local_500.phantoms = local_4b0;
            local_500.blocks.conflict = local_4ac;
            local_4b4 = local_4b4 + local_488.edges.internal.perfect;
            local_4b8 = local_4b8 + local_488.edges.internal.conflict;
            local_4bc = local_4bc + local_488.edges.external.perfect;
            local_500.edges.internal.conflict = local_4b8;
            local_500.edges.internal.perfect = local_4b4;
            local_4c0 = local_4c0 + local_488.edges.external.conflict;
            local_500.edges.external.conflict = local_4c0;
            local_500.edges.external.perfect = local_4bc;
            local_4c4 = local_4c4 + local_488.calls;
            local_4c8 = local_4c8 + local_488.indirects;
            local_500.indirects = local_4c8;
            local_500.calls = local_4c4;
            local_490 = (ulong)((int)local_490 + 1);
            Report::~Report(&local_3f0);
          }
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
    local_530._8_8_ = (ulong)local_544 << 0x20;
    local_530.phantoms = local_53c;
    local_530.blocks.conflict = local_540;
    local_530.edges.internal.conflict = local_548;
    local_530.edges.internal.perfect = local_538;
  }
  local_530.instrs = local_534;
  std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>::
  ~_Rb_tree(&local_420);
  if ((this->super_Strategy).m_config.detailed != false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total: ",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"present: cfgs(",0xe);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_490);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"), ",3);
  operator<<(poVar5,&local_530);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"missing: cfgs(0), ",0x12);
  operator<<((ostream *)&std::cout,&local_500);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void SpecificStrategy::process() {
	struct {
		SpecificStrategy::Stats present, missing;
	} total;

	if (m_fout.is_open())
		m_fout << "cfg,type,instrs,blocks_perfect,blocks_conflict,"
		       << "phantoms,"
		       << "edges_internal_perfect,edges_internal_conflict,"
			   << "edges_external_perfect,edges_external_conflict,"
			   << "calls,indirect" << std::endl;

	int cfgs = 0;
	for (CFG* aCFG : m_a->cfgs()) {
		if (aCFG->status() != CFG::VALID)
			continue;

		Addr addr = aCFG->addr();
		if (!this->isAddrInRange(addr))
			continue;

		CFG* bCFG = m_b->cfg(addr);
		if (bCFG == 0 || bCFG->status() != CFG::VALID)
			continue;

		SpecificStrategy::Report report = compareCFGs(aCFG, bCFG);

		SpecificStrategy::Stats aStats = this->extractStats(report.present);
		SpecificStrategy::Stats bStats = this->extractStats(report.missing);

		if (m_config.detailed) {
			std::cout << std::hex;
			std::cout << "CFG 0x" << aCFG->addr() << std::endl;
			std::cout << std::dec;
			std::cout << "present: " << aStats << std::endl;
			std::cout << "missing: " << bStats << std::endl;
			std::cout << std::endl;
		}

		if (m_fout.is_open()) {
			m_fout << "0x" << std::hex << aCFG->addr() << std::dec
					<< ",present," << aStats.instrs << ","
					<< aStats.blocks.perfect << "," << aStats.blocks.conflict << ","
					<< aStats.phantoms << ","
					<< aStats.edges.internal.perfect << "," << aStats.edges.internal.conflict << ","
					<< aStats.edges.external.perfect << "," << aStats.edges.external.conflict << ","
					<< aStats.calls << "," << aStats.indirects << std::endl;

			m_fout << "0x" << std::hex << bCFG->addr() << std::dec
					<< ",missing," << bStats.instrs << ","
					<< bStats.blocks.perfect << "," << bStats.blocks.conflict << ","
					<< bStats.phantoms << ","
					<< bStats.edges.internal.perfect << "," << bStats.edges.internal.conflict << ","
					<< bStats.edges.external.perfect << "," << bStats.edges.external.conflict << ","
					<< bStats.calls << "," << bStats.indirects << std::endl;
		}

		total.present += aStats;
		total.missing += bStats;

		cfgs++;
	}

	if (m_config.detailed)
		std::cout << "Total: " << std::endl;
	std::cout << "present: cfgs(" << cfgs << "), " << total.present << std::endl;
	std::cout << "missing: cfgs(0), " << total.missing << std::endl;
}